

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall SubcommandProgram_HelpOrder_Test::TestBody(SubcommandProgram_HelpOrder_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  AssertHelper local_198;
  Message local_190 [2];
  CallForHelp *anon_var_0_2;
  char *pcStack_178;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140 [32];
  iterator local_120;
  size_type local_118;
  AssertHelper local_110;
  Message local_108 [2];
  CallForHelp *anon_var_0_1;
  char *pcStack_f0;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8 [32];
  iterator local_98;
  size_type local_90;
  AssertHelper local_88;
  Message local_80 [2];
  CallForHelp *anon_var_0;
  char *pcStack_68;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  iterator local_20;
  size_type local_18;
  undefined1 local_10 [8];
  SubcommandProgram_HelpOrder_Test *this_local;
  
  gtest_msg.value._3_1_ = 1;
  local_48 = &local_40;
  local_10 = (undefined1  [8])this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"-h",&local_49);
  gtest_msg.value._3_1_ = 0;
  local_20 = &local_40;
  local_18 = 1;
  __l_01._M_len = 1;
  __l_01._M_array = local_20;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_SubcommandProgram).super_TApp.args,__l_01);
  local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
  do {
    local_1b8 = local_1b8 + -1;
    std::__cxx11::string::~string((string *)local_1b8);
  } while (local_1b8 != &local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff98,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff98);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run((TApp *)this);
    }
    if ((anon_var_0._7_1_ & 1) == 0) {
      pcStack_68 = 
      "Expected: run() throws an exception of type CLI::CallForHelp.\n  Actual: it throws nothing.";
      goto LAB_00127b05;
    }
  }
  else {
LAB_00127b05:
    testing::Message::Message(local_80);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x211,pcStack_68);
    testing::internal::AssertHelper::operator=(&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(local_80);
  }
  gtest_msg_1.value._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d8,"start",(allocator *)((long)&gtest_msg_1.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"-h",(allocator *)((long)&gtest_msg_1.value + 6));
  gtest_msg_1.value._5_1_ = 0;
  local_98 = &local_d8;
  local_90 = 2;
  __l_00._M_len = 2;
  __l_00._M_array = local_98;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_SubcommandProgram).super_TApp.args,__l_00);
  local_220 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98;
  do {
    local_220 = local_220 + -1;
    std::__cxx11::string::~string((string *)local_220);
  } while (local_220 != &local_d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff10,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff10);
  if (bVar1) {
    anon_var_0_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run((TApp *)this);
    }
    if ((anon_var_0_1._7_1_ & 1) != 0) goto LAB_00127f10;
    pcStack_f0 = 
    "Expected: run() throws an exception of type CLI::CallForHelp.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_108);
  testing::internal::AssertHelper::AssertHelper
            (&local_110,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x214,pcStack_f0);
  testing::internal::AssertHelper::operator=(&local_110,local_108);
  testing::internal::AssertHelper::~AssertHelper(&local_110);
  testing::Message::~Message(local_108);
LAB_00127f10:
  gtest_msg_2.value._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_160,"-h",(allocator *)((long)&gtest_msg_2.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"start",(allocator *)((long)&gtest_msg_2.value + 6));
  gtest_msg_2.value._5_1_ = 0;
  local_120 = &local_160;
  local_118 = 2;
  __l._M_len = 2;
  __l._M_array = local_120;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_SubcommandProgram).super_TApp.args,__l);
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120;
  do {
    local_288 = local_288 + -1;
    std::__cxx11::string::~string((string *)local_288);
  } while (local_288 != &local_160);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_2.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_2.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffe88,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffe88);
  if (bVar1) {
    anon_var_0_2._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run((TApp *)this);
    }
    if ((anon_var_0_2._7_1_ & 1) != 0) {
      return;
    }
    pcStack_178 = 
    "Expected: run() throws an exception of type CLI::CallForHelp.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_190);
  testing::internal::AssertHelper::AssertHelper
            (&local_198,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x217,pcStack_178);
  testing::internal::AssertHelper::operator=(&local_198,local_190);
  testing::internal::AssertHelper::~AssertHelper(&local_198);
  testing::Message::~Message(local_190);
  return;
}

Assistant:

TEST_F(SubcommandProgram, HelpOrder) {

    args = {"-h"};
    EXPECT_THROW(run(), CLI::CallForHelp);

    args = {"start", "-h"};
    EXPECT_THROW(run(), CLI::CallForHelp);

    args = {"-h", "start"};
    EXPECT_THROW(run(), CLI::CallForHelp);
}